

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  byte *pbVar6;
  ulong uVar7;
  archive_acl_entry *paVar8;
  int *piVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte *pbVar18;
  uint uVar19;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f0;
  wchar_t local_e8;
  wchar_t local_e4;
  wchar_t local_e0;
  wchar_t local_dc;
  undefined8 local_d8;
  ulong local_d0;
  uint local_c4;
  byte *local_c0;
  byte *local_b8;
  archive_acl *local_b0;
  archive_string_conv *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_c4 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_c4 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar5 = L'\0';
  local_b0 = acl;
  if (text == (char *)0x0) {
    local_dc = L'\0';
  }
  else {
    local_dc = L'\0';
    local_a8 = sc;
    if (*text != '\0') {
      uVar15 = (ulong)local_c4;
      local_a0 = uVar15 + 0xfffffffe;
      uVar7 = 0;
      local_dc = L'\0';
LAB_00183ff7:
      pbVar6 = (byte *)text;
      uVar17 = 0;
      do {
        while ((uVar11 = uVar17, uVar17 = (ulong)*pbVar6, uVar17 < 0x21 &&
               ((0x100000600U >> (uVar17 & 0x3f) & 1) != 0))) {
          pbVar6 = pbVar6 + 1;
          uVar17 = uVar11;
        }
        uVar16 = 0;
        while ((bVar10 = (byte)uVar17, 0x3a < bVar10 ||
               ((0x400100800000401U >> (uVar17 & 0x3f) & 1) == 0))) {
          lVar14 = uVar16 + 1;
          uVar16 = uVar16 + 1;
          uVar17 = (ulong)pbVar6[lVar14];
        }
        pbVar18 = pbVar6 + uVar16;
        pbVar13 = pbVar6;
        for (pbVar12 = pbVar18; (uVar16 != 0 && (pbVar13 = pbVar12, (ulong)pbVar12[-1] < 0x21));
            pbVar12 = pbVar12 + -1) {
          uVar16 = 0x100000600U >> ((ulong)pbVar12[-1] & 0x3f) & 1;
        }
        if (bVar10 == 0x23) {
          uVar17 = 0x23;
          while ((bVar10 = (byte)uVar17, 0x2c < bVar10 ||
                 ((0x100000000401U >> (uVar17 & 0x3f) & 1) == 0))) {
            pbVar12 = pbVar18 + 1;
            pbVar18 = pbVar18 + 1;
            uVar17 = (ulong)*pbVar12;
          }
        }
        text = (char *)(pbVar18 + (bVar10 != 0));
        if (uVar11 < uVar15) {
          (&local_98)[uVar11 * 2] = (long *)pbVar6;
          (&local_90)[uVar11 * 2] = (long)pbVar13;
        }
        pbVar6 = (byte *)text;
        uVar17 = uVar11 + 1;
      } while (bVar10 == 0x3a);
      uVar19 = (uint)uVar11;
      if ((uint)(uVar11 + 1) < local_c4) {
        memset(local_88 + uVar11 * 2,0,(ulong)((int)local_a0 - uVar19) * 0x10 + 0x10);
      }
      if ((local_98 != (long *)0x0) && (uVar17 = uVar7, (char)*local_98 == '#'))
      goto switchD_00184134_caseD_7;
      uVar11 = local_90 - (long)local_98;
      local_e0 = L'\0';
      if (want_type == L'㰀') {
        uVar17 = 0xffffffec;
        switch(uVar11) {
        case 4:
          if ((int)*local_98 == 0x72657375) {
            local_e4 = L'✑';
LAB_00184354:
            iVar3 = 1;
            local_e8 = L'\xffffffff';
            local_b8 = local_88[0];
            pbVar6 = local_88[1];
            wVar5 = local_e8;
            if (local_88[0] < local_88[1]) {
              wVar4 = L'\0';
              pbVar18 = local_88[0];
              do {
                bVar10 = *pbVar18;
                wVar5 = local_e8;
                if ((byte)(bVar10 - 0x3a) < 0xf6) break;
                wVar5 = L'\x7fffffff';
                if ((wVar4 < L'\x0ccccccd') && ((wVar4 != L'\x0ccccccc' || (bVar10 < 0x38)))) {
                  wVar5 = (uint)bVar10 + wVar4 * 10 + L'\xffffffd0';
                }
                wVar4 = wVar5;
                pbVar18 = pbVar18 + 1;
                wVar5 = wVar4;
              } while (pbVar18 != local_88[1]);
            }
            goto LAB_0018450a;
          }
          break;
        case 5:
          if (*(char *)((long)local_98 + 4) == 'p' && (int)*local_98 == 0x756f7267) {
            local_e4 = L'✓';
            goto LAB_00184354;
          }
          break;
        case 6:
          if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
            local_e4 = L'✒';
          }
          else {
            if (*(short *)((long)local_98 + 4) != 0x4070 || (int)*local_98 != 0x756f7267) break;
            local_e4 = L'✔';
          }
LAB_001844ff:
          local_e8 = L'\xffffffff';
          local_b8 = (byte *)0x0;
          iVar3 = 0;
          pbVar6 = (byte *)0x0;
          wVar5 = local_e8;
LAB_0018450a:
          local_e8 = wVar5;
          uVar17 = (ulong)(uint)(iVar3 << 4);
          pbVar18 = *(byte **)((long)local_88 + uVar17);
          pbVar12 = *(byte **)((long)local_88 + uVar17 + 8);
          if (pbVar18 < pbVar12) {
            local_e0 = L'\0';
LAB_0018452b:
            bVar10 = *pbVar18;
            if (bVar10 < 99) {
              if (bVar10 < 0x44) {
                if (bVar10 == 0x2d) goto LAB_001845fb;
                if (bVar10 != 0x41) {
                  if (bVar10 == 0x43) {
                    uVar19 = 0x2000;
                    goto LAB_001845f8;
                  }
                  goto switchD_0018456b_caseD_71;
                }
                uVar19 = 0x400;
              }
              else if (bVar10 < 0x57) {
                if (bVar10 != 0x44) {
                  if (bVar10 == 0x52) {
                    uVar19 = 0x40;
                    goto LAB_001845f8;
                  }
                  goto switchD_0018456b_caseD_71;
                }
                uVar19 = 0x100;
              }
              else if (bVar10 == 0x57) {
                uVar19 = 0x80;
              }
              else {
                if (bVar10 != 0x61) goto switchD_0018456b_caseD_71;
                uVar19 = 0x200;
              }
            }
            else {
              switch(bVar10) {
              case 0x6f:
                uVar19 = 0x4000;
                break;
              case 0x70:
                uVar19 = 0x20;
                break;
              case 0x71:
              case 0x74:
              case 0x75:
              case 0x76:
                goto switchD_0018456b_caseD_71;
              case 0x72:
                uVar19 = 8;
                break;
              case 0x73:
                uVar19 = 0x8000;
                break;
              case 0x77:
                uVar19 = 0x10;
                break;
              case 0x78:
                uVar19 = 1;
                break;
              default:
                if (bVar10 == 99) {
                  uVar19 = 0x1000;
                }
                else {
                  if (bVar10 != 100) goto switchD_0018456b_caseD_71;
                  uVar19 = 0x800;
                }
              }
            }
LAB_001845f8:
            local_e0 = local_e0 | uVar19;
LAB_001845fb:
            pbVar18 = pbVar18 + 1;
            if (pbVar18 == pbVar12) goto LAB_0018460c;
            goto LAB_0018452b;
          }
LAB_0018460c:
          pbVar18 = *(byte **)((long)local_88 + uVar17 + 0x10);
          pbVar12 = *(byte **)((long)local_88 + uVar17 + 0x18);
          if (pbVar18 < pbVar12) {
LAB_00184625:
            bVar10 = *pbVar18;
            if (bVar10 < 100) {
              if (bVar10 < 0x49) {
                if (bVar10 != 0x2d) {
                  if (bVar10 == 0x46) {
                    uVar19 = 0x40000000;
                    goto LAB_0018469d;
                  }
                  goto switchD_0018456b_caseD_71;
                }
                goto LAB_001846a0;
              }
              if (bVar10 != 0x49) {
                if (bVar10 == 0x53) {
                  uVar19 = 0x20000000;
                  goto LAB_0018469d;
                }
                goto switchD_0018456b_caseD_71;
              }
              uVar19 = 0x1000000;
            }
            else if (bVar10 < 0x69) {
              if (bVar10 == 100) {
                uVar19 = 0x4000000;
              }
              else {
                uVar19 = 0x2000000;
                if (bVar10 != 0x66) goto switchD_0018456b_caseD_71;
              }
            }
            else if (bVar10 == 0x69) {
              uVar19 = 0x10000000;
            }
            else {
              if (bVar10 != 0x6e) goto switchD_0018456b_caseD_71;
              uVar19 = 0x8000000;
            }
LAB_0018469d:
            local_e0 = local_e0 | uVar19;
LAB_001846a0:
            pbVar18 = pbVar18 + 1;
            if (pbVar18 == pbVar12) goto LAB_001846b1;
            goto LAB_00184625;
          }
LAB_001846b1:
          piVar9 = *(int **)((long)local_88 + uVar17 + 0x20);
          lVar14 = *(long *)((long)alStack_60 + uVar17) - (long)piVar9;
          if (lVar14 != 5) {
            if ((lVar14 == 4) && (*piVar9 == 0x796e6564)) {
              local_f0 = L'ࠀ';
              goto LAB_001847bb;
            }
            goto LAB_00184953;
          }
          if ((char)piVar9[1] == 'w' && *piVar9 == 0x6f6c6c61) {
            local_f0 = L'Ѐ';
          }
          else if ((char)piVar9[1] == 't' && *piVar9 == 0x69647561) {
            local_f0 = L'က';
          }
          else {
            if ((char)piVar9[1] != 'm' || *piVar9 != 0x72616c61) goto LAB_00184953;
            local_f0 = L'\x2000';
          }
LAB_001847bb:
          pbVar18 = *(byte **)((long)alStack_60 + uVar17 + 8);
          pbVar12 = *(byte **)((long)alStack_60 + uVar17 + 0x10);
          wVar5 = local_e8;
          local_d0 = uVar7;
          local_c0 = pbVar6;
          if (pbVar18 < pbVar12) {
            wVar4 = L'\0';
            do {
              bVar10 = *pbVar18;
              wVar5 = local_e8;
              if ((byte)(bVar10 - 0x3a) < 0xf6) break;
              wVar5 = L'\x7fffffff';
              if ((wVar4 < L'\x0ccccccd') && ((wVar4 != L'\x0ccccccc' || (bVar10 < 0x38)))) {
                wVar5 = (uint)bVar10 + wVar4 * 10 + L'\xffffffd0';
              }
              wVar4 = wVar5;
              pbVar18 = pbVar18 + 1;
              wVar5 = wVar4;
            } while (pbVar18 != pbVar12);
          }
LAB_00184896:
          local_e8 = wVar5;
          wVar5 = local_e0;
          wVar4 = acl_special(local_b0,local_f0,local_e0,local_e4);
          if (wVar4 == L'\0') {
LAB_00184929:
            uVar19 = (uint)local_d0;
          }
          else {
            paVar8 = acl_new_entry(local_b0,local_f0,wVar5,local_e4,local_e8);
            if (paVar8 == (archive_acl_entry *)0x0) {
              return L'\xffffffe7';
            }
            if (((local_b8 == (byte *)0x0) || (local_c0 == local_b8)) || (*local_b8 == 0)) {
              archive_mstring_clean(&paVar8->name);
              goto LAB_00184929;
            }
            wVar5 = archive_mstring_copy_mbs_len_l
                              (&paVar8->name,(char *)local_b8,(long)local_c0 - (long)local_b8,
                               local_a8);
            uVar19 = (uint)local_d0;
            if (wVar5 != L'\0') {
              piVar9 = __errno_location();
              uVar19 = 0xffffffec;
              if (*piVar9 == 0xc) {
                return L'\xffffffe2';
              }
            }
          }
          local_dc = local_dc | local_f0;
          uVar17 = (ulong)uVar19;
          goto switchD_001842b1_caseD_1;
        case 9:
          if ((char)local_98[1] == '@' && *local_98 == 0x656e6f7972657665) {
            local_e4 = L'❻';
            goto LAB_001844ff;
          }
        }
      }
      else {
        local_d8 = 0;
        local_f0 = want_type;
        if ((char)*local_98 == 'd') {
          if (uVar11 == 1) {
LAB_00184161:
            local_f0 = L'Ȁ';
            local_d8 = 1;
          }
          else if ((6 < uVar11) &&
                  (*(short *)((long)local_98 + 5) == 0x746c &&
                   *(int *)((long)local_98 + 1) == 0x75616665)) {
            if (uVar11 == 7) goto LAB_00184161;
            local_f0 = L'Ȁ';
            local_98 = (long *)((long)local_98 + 7);
          }
        }
        iVar3 = (int)local_d8;
        uVar17 = (ulong)((iVar3 + 1U) * 0x10);
        pbVar6 = *(byte **)((long)&local_98 + uVar17);
        pbVar18 = *(byte **)((long)&local_90 + uVar17);
        if (pbVar6 < pbVar18) {
          wVar5 = L'\0';
          pbVar12 = pbVar6;
          do {
            bVar10 = *pbVar12;
            if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_00184201;
            wVar4 = L'\x7fffffff';
            if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (bVar10 < 0x38)))) {
              wVar4 = (uint)bVar10 + wVar5 * 10 + L'\xffffffd0';
            }
            wVar5 = wVar4;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar18);
          if (wVar5 == L'\xffffffff') goto LAB_00184201;
        }
        else {
LAB_00184201:
          if (iVar3 + 3U <= uVar19) {
            uVar17 = (ulong)((iVar3 + 3U) * 0x10);
            pbVar12 = *(byte **)((long)&local_98 + uVar17);
            pbVar13 = *(byte **)((long)&local_90 + uVar17);
            if (pbVar12 < pbVar13) {
              wVar5 = L'\0';
              do {
                bVar10 = *pbVar12;
                if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_00184262;
                wVar4 = L'\x7fffffff';
                if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (bVar10 < 0x38)))) {
                  wVar4 = (uint)bVar10 + wVar5 * 10 + L'\xffffffd0';
                }
                wVar5 = wVar4;
                pbVar12 = pbVar12 + 1;
              } while (pbVar12 != pbVar13);
              goto LAB_00184268;
            }
          }
LAB_00184262:
          wVar5 = L'\xffffffff';
        }
LAB_00184268:
        pcVar1 = *(char **)((long)&local_98 + (ulong)(uint)(iVar3 << 4));
        pcVar2 = *(char **)((long)&local_90 + (ulong)(uint)(iVar3 << 4));
        uVar17 = 0xffffffec;
        lVar14 = (long)pcVar2 - (long)pcVar1;
        if (pcVar2 == pcVar1) goto switchD_001842b1_caseD_1;
        switch((int)*pcVar1 - 0x67U >> 1 | (uint)(((int)*pcVar1 - 0x67U & 1) != 0) << 0x1f) {
        case 0:
          wVar4 = L'✔';
          local_e4 = L'✓';
          if ((lVar14 != 1) &&
             ((lVar14 != 5 ||
              (wVar4 = L'✔', local_e4 = L'✓', *(int *)(pcVar1 + 1) != 0x70756f72)))) break;
LAB_001844ca:
          iVar3 = 0;
          if ((pbVar18 <= pbVar6) && (wVar5 == L'\xffffffff')) {
            pbVar18 = (byte *)0x0;
            pbVar6 = (byte *)0x0;
            iVar3 = 0;
            local_e4 = wVar4;
          }
LAB_00184844:
          local_d0 = uVar7;
          local_c0 = pbVar18;
          local_b8 = pbVar6;
          if ((local_e0 != L'\0') ||
             (uVar7 = (ulong)((int)local_d8 + iVar3 + 2),
             wVar4 = ismode((char *)(&local_98)[uVar7 * 2],(char *)(&local_90)[uVar7 * 2],&local_e0)
             , wVar4 != L'\0')) goto LAB_00184896;
          goto LAB_00184953;
        case 3:
          local_e4 = L'✕';
          if ((lVar14 == 1) ||
             ((lVar14 == 4 && (pcVar1[3] == 'k' && *(short *)(pcVar1 + 1) == 0x7361)))) {
LAB_00184450:
            if (iVar3 + 1U == uVar19) {
              if (pbVar18 <= pbVar6) goto LAB_0018475a;
              local_d0 = uVar7;
              wVar4 = ismode((char *)pbVar6,(char *)pbVar18,&local_e0);
              if (wVar4 == L'\0') {
                uVar17 = 0xffffffec;
                if ((int)local_d8 + 2U == uVar19) goto switchD_00184134_caseD_7;
                iVar3 = 0;
              }
              else {
                iVar3 = -1;
              }
              pbVar6 = (byte *)0x0;
              pbVar18 = (byte *)0x0;
              uVar7 = local_d0;
            }
            else {
              if ((iVar3 + 2U == uVar19) && (pbVar6 < pbVar18)) break;
LAB_0018475a:
              pbVar18 = (byte *)0x0;
              pbVar6 = (byte *)0x0;
              iVar3 = 0;
            }
            goto LAB_00184844;
          }
          break;
        case 4:
          local_e4 = L'✖';
          if ((lVar14 == 1) || ((lVar14 == 5 && (*(int *)(pcVar1 + 1) == 0x72656874))))
          goto LAB_00184450;
          break;
        case 7:
          wVar4 = L'✒';
          local_e4 = L'✑';
          if ((lVar14 == 1) ||
             ((lVar14 == 4 &&
              (wVar4 = L'✒', local_e4 = L'✑',
              pcVar1[3] == 'r' && *(short *)(pcVar1 + 1) == 0x6573)))) goto LAB_001844ca;
        }
switchD_001842b1_caseD_1:
      }
      goto switchD_00184134_caseD_7;
    }
  }
LAB_00184963:
  archive_acl_reset(local_b0,local_dc);
  return wVar5;
switchD_0018456b_caseD_71:
LAB_00184953:
  uVar17 = 0xffffffec;
switchD_00184134_caseD_7:
  uVar7 = uVar17;
  wVar5 = (wchar_t)uVar7;
  if (*text == 0) goto LAB_00184963;
  goto LAB_00183ff7;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			#ifdef __clang_analyzer__
			assert(s);
			#endif
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}